

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O1

void QTimer::singleShot(nanoseconds ns,TimerType timerType,QObject *receiver,char *member)

{
  QSingleShotTimer *this;
  char *pcVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  storage_type *in_stack_ffffffffffffff98;
  QByteArray local_60;
  void *local_48;
  char *pcStack_40;
  QMetaTypeInterface *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (ns.__r < 0) {
    singleShot();
    ns.__r = 1000000;
  }
  if (member != (char *)0x0 && receiver != (QObject *)0x0) {
    if (ns.__r == 0) {
      pcVar1 = strchr(member,0x28);
      if ((pcVar1 == (char *)0x0) || (2 < (byte)(*member - 0x30U))) {
        singleShot();
      }
      else {
        QVar2.m_data = in_stack_ffffffffffffff98;
        QVar2.m_size = 0x2ce315;
        QVar2 = QtPrivate::trimmed(QVar2);
        QByteArray::QByteArray(&local_60,QVar2.m_data,QVar2.m_size);
        if (local_60.d.ptr == (char *)0x0) {
          local_60.d.ptr = "";
        }
        local_48 = (void *)0x0;
        pcStack_40 = (char *)0x0;
        local_38 = (QMetaTypeInterface *)0x0;
        QMetaObject::invokeMethodImpl
                  (receiver,local_60.d.ptr,QueuedConnection,1,&local_48,&pcStack_40,&local_38);
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
    }
    else {
      this = (QSingleShotTimer *)operator_new(0x18);
      QSingleShotTimer::QSingleShotTimer(this,(Duration)ns.__r,timerType,receiver,member);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTimer::singleShot(std::chrono::nanoseconds ns, Qt::TimerType timerType,
                        const QObject *receiver, const char *member)
{
    if (ns < 0ns) {
        qWarning("QTimer::singleShot: negative intervals aren't allowed; the "
                 "interval will be set to 1ms.");
        ns = 1ms;
    }
    if (receiver && member) {
        if (ns == 0ns) {
            // special code shortpath for 0-timers
            const char* bracketPosition = strchr(member, '(');
            if (!bracketPosition || !(member[0] >= '0' && member[0] <= '2')) {
                qWarning("QTimer::singleShot: Invalid slot specification");
                return;
            }
            const auto methodName = QByteArrayView(member + 1, // extract method name
                                                   bracketPosition - 1 - member).trimmed();
            QMetaObject::invokeMethod(const_cast<QObject *>(receiver), methodName.toByteArray().constData(),
                                      Qt::QueuedConnection);
            return;
        }
        (void) new QSingleShotTimer(ns, timerType, receiver, member);
    }
}